

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void arm_pmu_timer_cb_arm(void *opaque)

{
  ARMCPU *cpu;
  void *opaque_local;
  
  pmu_op_start_arm((CPUARMState *)((long)opaque + 0xa2f0));
  pmu_op_finish_arm((CPUARMState *)((long)opaque + 0xa2f0));
  return;
}

Assistant:

void arm_pmu_timer_cb(void *opaque)
{
    ARMCPU *cpu = opaque;

    /*
     * Update all the counter values based on the current underlying counts,
     * triggering interrupts to be raised, if necessary. pmu_op_finish() also
     * has the effect of setting the cpu->pmu_timer to the next earliest time a
     * counter may expire.
     */
    pmu_op_start(&cpu->env);
    pmu_op_finish(&cpu->env);
}